

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_968dc1::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody
          (RSATest_DISABLED_BlindingCacheConcurrency_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  allocator_type *paVar3;
  undefined1 auVar4 [8];
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_a232c0a2_for__M_head_impl *__args;
  thread *thread;
  undefined1 auVar5 [8];
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  long lVar6;
  char *in_R9;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_class_16_2_a232c0a2_for__M_head_impl worker;
  UniquePtr<RSA> rsa;
  uint8_t kDummyHash [32];
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  allocator_type *local_88;
  thread local_80;
  string *local_78;
  AssertHelper local_70;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_68;
  size_type local_60;
  string local_58;
  
  local_68._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_private_key_from_bytes((uint8_t *)&(anonymous_namespace)::kKey1,0x260);
  local_98[0] = (tuple<rsa_st_*,_bssl::internal::Deleter>)
                local_68._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_rsa_st_*,_false>)0x0;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
      local_68._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_rsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)local_98,(AssertionResult *)0x5ca185,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x5c9,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_80._M_id._M_thread != 0) {
      (**(code **)((long)*(__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true> *)
                          local_80._M_id._M_thread + 8))();
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
  }
  else {
    local_80._M_id._M_thread = (id)&local_68;
    local_78 = &local_58;
    local_58.field_2._M_allocated_capacity = 0;
    local_58.field_2._8_8_ = 0;
    local_58._M_dataplus._M_p = (char *)0x0;
    local_58._M_string_length = 0;
    local_98 = (undefined1  [8])0x0;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = (allocator_type *)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_98,0x800);
    lVar6 = 0;
    __args = extraout_RDX;
    do {
      pbVar1 = pbStack_90;
      auVar5 = local_98;
      if (pbStack_90 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
        if ((long)pbStack_90 - (long)local_98 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar7 = (long)pbStack_90 - (long)local_98 >> 3;
        uVar2 = uVar7 + (uVar7 == 0);
        local_60 = uVar2 + uVar7;
        if (0xffffffffffffffe < local_60) {
          local_60 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar2,uVar7)) {
          local_60 = 0xfffffffffffffff;
        }
        if (local_60 == 0) {
          paVar3 = (allocator_type *)0x0;
        }
        else {
          paVar3 = (allocator_type *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)local_98,local_60,(void *)0x0);
          __args = extraout_RDX_01;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                  (paVar3 + uVar7 * 8,&local_80,__args);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar3;
        for (auVar4 = auVar5; auVar4 != (undefined1  [8])pbVar1;
            auVar4 = (undefined1  [8])((long)auVar4 + 8)) {
          ((id *)&((allocator_type *)pbVar8)->field_0x0)->_M_thread = 0;
          ((id *)&((allocator_type *)pbVar8)->field_0x0)->_M_thread =
               ((id *)&((allocator_type *)auVar4)->field_0x0)->_M_thread;
          ((id *)&((allocator_type *)auVar4)->field_0x0)->_M_thread = 0;
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)pbVar8 + 8);
        }
        __args = extraout_RDX_02;
        if (auVar5 != (undefined1  [8])0x0) {
          operator_delete((void *)auVar5,(long)local_88 - (long)auVar5);
          __args = extraout_RDX_03;
        }
        local_88 = paVar3 + local_60 * 8;
        local_98 = (undefined1  [8])paVar3;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                  ((allocator_type *)pbStack_90,&local_80,__args);
        __args = extraout_RDX_00;
        pbVar8 = pbStack_90;
      }
      pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)pbVar8 + 8);
      pbVar1 = pbStack_90;
      lVar6 = lVar6 + 1;
      auVar5 = local_98;
    } while (lVar6 != 0x800);
    for (; auVar5 != (undefined1  [8])pbVar1; auVar5 = (undefined1  [8])((long)auVar5 + 8)) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_98);
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
  return;
}

Assistant:

TEST(RSATest, DISABLED_BlindingCacheConcurrency) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);

#if defined(OPENSSL_TSAN)
  constexpr size_t kSignaturesPerThread = 10;
  constexpr size_t kNumThreads = 10;
#else
  constexpr size_t kSignaturesPerThread = 100;
  constexpr size_t kNumThreads = 2048;
#endif

  const uint8_t kDummyHash[32] = {0};
  auto worker = [&] {
    std::vector<uint8_t> sig(RSA_size(rsa.get()));
    for (size_t i = 0; i < kSignaturesPerThread; i++) {
      unsigned sig_len = sig.size();
      EXPECT_TRUE(RSA_sign(NID_sha256, kDummyHash, sizeof(kDummyHash),
                           sig.data(), &sig_len, rsa.get()));
    }
  };

  std::vector<std::thread> threads;
  threads.reserve(kNumThreads);
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back(worker);
  }
  for (auto &thread : threads) {
    thread.join();
  }
}